

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O0

int __thiscall brown::App::runLogic(App *this)

{
  App *this_local;
  
  if (this->userInit != (_func_void_Simulator_ptr *)0x0) {
    (*this->userInit)(this->sim);
  }
  while (((this->isBreak ^ 0xffU) & 1) != 0) {
    (**this->sim->_vptr_Simulator)();
    if (this->userLoop != (_func_void_Simulator_ptr *)0x0) {
      (*this->userLoop)(this->sim);
    }
  }
  return 0;
}

Assistant:

int App::runLogic() {
    if (userInit) {userInit(sim);}
    while (!isBreak) {
        sim.hardwareLoop();
        if (userLoop) {userLoop(sim);}
    }
    return 0;
}